

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

SpectrumImageTexture *
pbrt::SpectrumImageTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Alloc_hider __s1;
  Allocator AVar4;
  FilterFunction FVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  char *pcVar8;
  Float FVar9;
  bool invert;
  WrapMode local_120;
  char local_11c;
  string filename;
  string wrapString;
  string encodingString;
  Float scale;
  MIPMapFilterOptions local_ac;
  SpectrumType spectrumType_local;
  ColorEncodingHandle encoding;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_80;
  Allocator alloc_local;
  string filter;
  TextureMapping2DHandle map;
  
  spectrumType_local = spectrumType;
  alloc_local = alloc;
  TextureMapping2DHandle::Create(&map,parameters->dict,renderFromTexture,loc,alloc);
  paVar1 = &wrapString.field_2;
  wrapString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&wrapString,"maxanisotropy","");
  FVar9 = TextureParameterDictionary::GetOneFloat(parameters,&wrapString,8.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapString._M_dataplus._M_p != paVar1) {
    operator_delete(wrapString._M_dataplus._M_p,
                    CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                             wrapString.field_2._M_local_buf[0]) + 1);
  }
  wrapString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&wrapString,"filter","");
  paVar2 = &filename.field_2;
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"bilinear","");
  TextureParameterDictionary::GetOneString(&filter,parameters,&wrapString,&filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapString._M_dataplus._M_p != paVar1) {
    operator_delete(wrapString._M_dataplus._M_p,
                    CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                             wrapString.field_2._M_local_buf[0]) + 1);
  }
  local_ac.filter = EWA;
  local_ac.maxAnisotropy = FVar9;
  iVar7 = std::__cxx11::string::compare((char *)&filter);
  FVar5 = EWA;
  if ((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)&filter), iVar7 != 0)) {
    iVar7 = std::__cxx11::string::compare((char *)&filter);
    if (iVar7 == 0) {
      FVar5 = Trilinear;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&filter);
      if (iVar7 == 0) {
        FVar5 = Bilinear;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&filter);
        if (iVar7 == 0) {
          FVar5 = Point;
        }
        else {
          wrapString._M_string_length = 0;
          wrapString.field_2._M_local_buf[0] = '\0';
          wrapString._M_dataplus._M_p = (pointer)paVar1;
          detail::stringPrintfRecursive<std::__cxx11::string&>
                    (&wrapString,"%s: filter function unknown",&filter);
          Error(loc,wrapString._M_dataplus._M_p);
          FVar5 = local_ac.filter;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)wrapString._M_dataplus._M_p != paVar1) {
            operator_delete(wrapString._M_dataplus._M_p,
                            CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                                     wrapString.field_2._M_local_buf[0]) + 1);
            FVar5 = local_ac.filter;
          }
        }
      }
    }
  }
  local_ac.filter = FVar5;
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"wrap","");
  paVar1 = &encodingString.field_2;
  encodingString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encodingString,"repeat","");
  TextureParameterDictionary::GetOneString(&wrapString,parameters,&filename,&encodingString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != paVar1) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  __s1._M_p = wrapString._M_dataplus._M_p;
  iVar7 = strcmp(wrapString._M_dataplus._M_p,"clamp");
  if (iVar7 == 0) {
    local_120 = Clamp;
  }
  else {
    iVar7 = strcmp(__s1._M_p,"repeat");
    if (iVar7 == 0) {
      local_120 = Repeat;
    }
    else {
      iVar7 = strcmp(__s1._M_p,"black");
      if (iVar7 == 0) {
        local_120 = Black;
      }
      else {
        iVar7 = strcmp(__s1._M_p,"octahedralsphere");
        if (iVar7 != 0) {
          ErrorExit<std::__cxx11::string&>("%s: wrap mode unknown",&wrapString);
        }
        local_120 = OctahedralSphere;
      }
    }
  }
  local_11c = '\x01';
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"scale","");
  scale = TextureParameterDictionary::GetOneFloat(parameters,&filename,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"invert","");
  invert = TextureParameterDictionary::GetOneBool(parameters,&filename,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            )&local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encoding,"filename","");
  paVar3 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  TextureParameterDictionary::GetOneString(&encodingString,parameters,(string *)&encoding,&local_80)
  ;
  ResolveFilename(&filename,&encodingString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != paVar1) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar3) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (encoding.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits != (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                )&local_90) {
    operator_delete((void *)encoding.
                            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                            .bits,local_90._M_allocated_capacity + 1);
  }
  encodingString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encodingString,"png","");
  bVar6 = HasExtension(&filename,&encodingString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != paVar1) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            )&local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encoding,"encoding","");
  pcVar8 = "linear";
  if (bVar6) {
    pcVar8 = "sRGB";
  }
  local_80._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,pcVar8,pcVar8 + (ulong)!bVar6 * 2 + 4);
  TextureParameterDictionary::GetOneString(&encodingString,parameters,(string *)&encoding,&local_80)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar3) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (encoding.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits != (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                )&local_90) {
    operator_delete((void *)encoding.
                            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                            .bits,local_90._M_allocated_capacity + 1);
  }
  AVar4.memoryResource = alloc_local.memoryResource;
  ColorEncodingHandle::Get((string *)&encoding,(memory_resource *)&encodingString);
  if (local_11c == '\0') {
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x2c83e3c);
  }
  iVar7 = (*(AVar4.memoryResource)->_vptr_memory_resource[2])(AVar4.memoryResource,0x20,8);
  pstd::pmr::polymorphic_allocator<std::byte>::
  construct<pbrt::SpectrumImageTexture,pbrt::TextureMapping2DHandle&,std::__cxx11::string&,pbrt::MIPMapFilterOptions&,pbrt::WrapMode&,float&,bool&,pbrt::ColorEncodingHandle&,pbrt::SpectrumType&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (&alloc_local,(SpectrumImageTexture *)CONCAT44(extraout_var,iVar7),&map,&filename,
             &local_ac,&local_120,&scale,&invert,&encoding,&spectrumType_local,&alloc_local);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != paVar1) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapString._M_dataplus._M_p != &wrapString.field_2) {
    operator_delete(wrapString._M_dataplus._M_p,
                    CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                             wrapString.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filter._M_dataplus._M_p != &filter.field_2) {
    operator_delete(filter._M_dataplus._M_p,filter.field_2._M_allocated_capacity + 1);
  }
  return (SpectrumImageTexture *)CONCAT44(extraout_var,iVar7);
}

Assistant:

SpectrumImageTexture *SpectrumImageTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    // Initialize _ImageTexture_ parameters
    Float maxAniso = parameters.GetOneFloat("maxanisotropy", 8.f);
    std::string filter = parameters.GetOneString("filter", "bilinear");
    MIPMapFilterOptions filterOptions;
    filterOptions.maxAnisotropy = maxAniso;
    pstd::optional<FilterFunction> ff = ParseFilter(filter);
    if (ff)
        filterOptions.filter = *ff;
    else
        Error(loc, "%s: filter function unknown", filter);

    std::string wrapString = parameters.GetOneString("wrap", "repeat");
    pstd::optional<WrapMode> wrapMode = ParseWrapMode(wrapString.c_str());
    if (!wrapMode)
        ErrorExit("%s: wrap mode unknown", wrapString);
    Float scale = parameters.GetOneFloat("scale", 1.f);
    bool invert = parameters.GetOneBool("invert", false);
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));

    const char *defaultEncoding = HasExtension(filename, "png") ? "sRGB" : "linear";
    std::string encodingString = parameters.GetOneString("encoding", defaultEncoding);
    ColorEncodingHandle encoding = ColorEncodingHandle::Get(encodingString, alloc);

    return alloc.new_object<SpectrumImageTexture>(map, filename, filterOptions, *wrapMode,
                                                  scale, invert, encoding, spectrumType,
                                                  alloc);
}